

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbePmaReaderClear(PmaReader *pReadr)

{
  sqlite3_free(pReadr->aAlloc);
  sqlite3_free(pReadr->aBuffer);
  if (pReadr->aMap != (u8 *)0x0) {
    (*pReadr->pFd->pMethods->xUnfetch)(pReadr->pFd,0,pReadr->aMap);
  }
  vdbeIncrFree(pReadr->pIncr);
  pReadr->aMap = (u8 *)0x0;
  pReadr->pIncr = (IncrMerger *)0x0;
  pReadr->aBuffer = (u8 *)0x0;
  *(undefined8 *)&pReadr->nBuffer = 0;
  pReadr->aAlloc = (u8 *)0x0;
  pReadr->aKey = (u8 *)0x0;
  pReadr->nAlloc = 0;
  pReadr->nKey = 0;
  pReadr->pFd = (sqlite3_file *)0x0;
  pReadr->iReadOff = 0;
  pReadr->iEof = 0;
  return;
}

Assistant:

static void vdbePmaReaderClear(PmaReader *pReadr){
  sqlite3_free(pReadr->aAlloc);
  sqlite3_free(pReadr->aBuffer);
  if( pReadr->aMap ) sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
  vdbeIncrFree(pReadr->pIncr);
  memset(pReadr, 0, sizeof(PmaReader));
}